

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O3

void Gia_ManPrintReached(char *pStr,int iState,Vec_Int_t *vReached)

{
  long lVar1;
  
  printf("Reached from state %d \'%c\':  ",(long)iState,(ulong)(uint)(int)pStr[iState]);
  if (0 < vReached->nSize) {
    lVar1 = 0;
    do {
      printf("%d \'%c\'  ",(long)vReached->pArray[lVar1],
             (ulong)(uint)(int)pStr[vReached->pArray[lVar1]]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < vReached->nSize);
  }
  putchar(10);
  return;
}

Assistant:

void Gia_ManPrintReached( char * pStr, int iState, Vec_Int_t * vReached )
{
    int i, Entry;
    printf( "Reached from state %d \'%c\':  ", iState, pStr[iState] );
    Vec_IntForEachEntry( vReached, Entry, i )
        printf( "%d \'%c\'  ", Entry, pStr[Entry] );
    printf( "\n" );
}